

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_updates.cc
# Opt level: O2

void __thiscall
tchecker::clock_updates_list_t::absorbing_merge(clock_updates_list_t *this,clock_updates_list_t *l)

{
  if ((this->_list).
      super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->_list).
      super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>::
    _M_erase_at_end(&this->_list,
                    (this->_list).
                    super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    return;
  }
  if ((l->_list).
      super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (l->_list).
      super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>::clear
              (&this->_list);
    return;
  }
  std::vector<tchecker::clock_update_t,std::allocator<tchecker::clock_update_t>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<tchecker::clock_update_t_const*,std::vector<tchecker::clock_update_t,std::allocator<tchecker::clock_update_t>>>>
            ();
  return;
}

Assistant:

void clock_updates_list_t::absorbing_merge(tchecker::clock_updates_list_t const & l)
{
  if (empty() || l.empty())
    clear();
  else
    _list.insert(_list.end(), l.begin(), l.end());
}